

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::compiler::Token::Builder::initParenthesizedList
          (Builder *__return_storage_ptr__,Builder *this,uint size)

{
  uint uVar1;
  PointerBuilder local_30;
  uint local_14;
  Builder *pBStack_10;
  uint size_local;
  Builder *this_local;
  
  local_14 = size;
  pBStack_10 = this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::compiler::Token::Which>
            (&this->_builder,uVar1,PARENTHESIZED_LIST);
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::getPointerField(&local_30,&this->_builder,uVar1);
  capnp::_::
  PointerHelpers<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>,_(capnp::Kind)6>
  ::init((PointerHelpers<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>,_(capnp::Kind)6>
          *)__return_storage_ptr__,(EVP_PKEY_CTX *)(ulong)local_14);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List< ::capnp::List< ::capnp::compiler::Token,  ::capnp::Kind::STRUCT>,  ::capnp::Kind::LIST>::Builder Token::Builder::initParenthesizedList(unsigned int size) {
  _builder.setDataField<Token::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Token::PARENTHESIZED_LIST);
  return ::capnp::_::PointerHelpers< ::capnp::List< ::capnp::List< ::capnp::compiler::Token,  ::capnp::Kind::STRUCT>,  ::capnp::Kind::LIST>>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), size);
}